

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap.c
# Opt level: O0

int swap_little_endian(void)

{
  char *c;
  uint32 l;
  
  return 1;
}

Assistant:

int
swap_little_endian()
{
    uint32 l;
    char *c;

    l = 1;

    c = (char *)&l;

    if (*c) {
	return TRUE;
    }
    else {
	return FALSE;
    }
}